

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxOut.cpp
# Opt level: O0

void __thiscall OpenMD::FluxOut::doFrame(FluxOut *this,int frame)

{
  bool bVar1;
  int iVar2;
  SelectionManager *this_00;
  size_type sVar3;
  reference pvVar4;
  long in_RDI;
  RealType deltaC;
  RealType deltaT;
  int n;
  RealType area;
  uint count1;
  int i;
  StuntDouble *sd;
  value_type_conflict *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SelectionEvaluator *in_stack_ffffffffffffff98;
  Snapshot *in_stack_ffffffffffffffd0;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x120));
  if (bVar1) {
    this_00 = (SelectionManager *)(in_RDI + 0x38);
    SelectionEvaluator::evaluate(in_stack_ffffffffffffff98);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
              );
    SelectionSet::~SelectionSet((SelectionSet *)0x1365a7);
  }
  SelectionManager::getSelectionCount((SelectionManager *)0x1365d4);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff60,(value_type_conflict1 *)in_stack_ffffffffffffff58);
  if (*(int *)(in_RDI + 0xd78) == 0) {
    Snapshot::getYZarea(in_stack_ffffffffffffffd0);
  }
  else if (*(int *)(in_RDI + 0xd78) == 1) {
    Snapshot::getXZarea(in_stack_ffffffffffffffd0);
  }
  else {
    Snapshot::getXYarea(in_stack_ffffffffffffffd0);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xcd8));
  iVar2 = (int)sVar3;
  if (1 < iVar2) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xcd8),(long)iVar2);
    this_01 = (vector<double,_std::allocator<double>_> *)*pvVar4;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xcd8),(long)(iVar2 + -1));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd48),(long)iVar2);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd48),(long)(iVar2 + -1));
    std::vector<double,_std::allocator<double>_>::push_back(this_01,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void FluxOut::doFrame(int frame) {
    StuntDouble* sd;
    int i;
    
    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    
    unsigned int count1 = seleMan1_.getSelectionCount();
    counts_.push_back(count1);

    RealType area;
    switch (axis_) {
    case 0:
      area = 2.0 * currentSnapshot_->getYZarea();
      break;
    case 1:
      area = 2.0 * currentSnapshot_->getXZarea();
      break;
    case 2:
    default:
      area = 2.0 * currentSnapshot_->getXYarea();
    }

    int n = times_.size();
    if (n > 1) {
      RealType deltaT = times_[n] - times_[n-1];
      RealType deltaC = counts_[n] - counts_[n-1];      
      values_.push_back(deltaC / (area * deltaT));
    }
  }